

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O2

void __thiscall
slang::syntax::ParenPragmaExpressionSyntax::ParenPragmaExpressionSyntax
          (ParenPragmaExpressionSyntax *this,Token openParen,
          SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax> *values,Token closeParen)

{
  size_t sVar1;
  SyntaxNode *pSVar2;
  undefined4 uVar3;
  PragmaExpressionSyntax *pPVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax> *__range2;
  iterator __begin2;
  iterator_base<slang::syntax::PragmaExpressionSyntax_*> local_30;
  
  uVar6 = closeParen._0_8_;
  uVar5 = openParen._0_8_;
  (this->super_PragmaExpressionSyntax).super_SyntaxNode.kind = ParenPragmaExpression;
  (this->super_PragmaExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (this->super_PragmaExpressionSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (this->openParen).kind = (short)uVar5;
  (this->openParen).field_0x2 = (char)((ulong)uVar5 >> 0x10);
  (this->openParen).numFlags = (NumericTokenFlags)(char)((ulong)uVar5 >> 0x18);
  (this->openParen).rawLen = (int)((ulong)uVar5 >> 0x20);
  (this->openParen).info = openParen.info;
  uVar3 = *(undefined4 *)&(values->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar2 = (values->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->values).super_SyntaxListBase.super_SyntaxNode.kind =
       (values->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this->values).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar3;
  (this->values).super_SyntaxListBase.super_SyntaxNode.parent = pSVar2;
  (this->values).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (values->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->values).super_SyntaxListBase.childCount = (values->super_SyntaxListBase).childCount;
  (this->values).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_002db800;
  sVar1 = (values->elements)._M_extent._M_extent_value;
  (this->values).elements._M_ptr = (values->elements)._M_ptr;
  (this->values).elements._M_extent._M_extent_value = sVar1;
  (this->closeParen).kind = (short)uVar6;
  (this->closeParen).field_0x2 = (char)((ulong)uVar6 >> 0x10);
  (this->closeParen).numFlags = (NumericTokenFlags)(char)((ulong)uVar6 >> 0x18);
  (this->closeParen).rawLen = (int)((ulong)uVar6 >> 0x20);
  (this->closeParen).info = closeParen.info;
  (this->values).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  local_30.index = 0;
  sVar1 = (this->values).elements._M_extent._M_extent_value;
  local_30.list = &this->values;
  for (; (local_30.list != &this->values || (local_30.index != sVar1 + 1 >> 1));
      local_30.index = local_30.index + 1) {
    pPVar4 = SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::
             iterator_base<slang::syntax::PragmaExpressionSyntax_*>::dereference(&local_30);
    (pPVar4->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  return;
}

Assistant:

ParenPragmaExpressionSyntax(Token openParen, const SeparatedSyntaxList<PragmaExpressionSyntax>& values, Token closeParen) :
        PragmaExpressionSyntax(SyntaxKind::ParenPragmaExpression), openParen(openParen), values(values), closeParen(closeParen) {
        this->values.parent = this;
        for (auto child : this->values)
            child->parent = this;
    }